

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transforms.h
# Opt level: O2

sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_> * __thiscall
klogic::transform::
continuous<std::vector<std::complex<double>,std::allocator<std::complex<double>>>,std::vector<double,std::allocator<double>>>
          (sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
           *__return_storage_ptr__,transform *this,vector<double,_std::allocator<double>_> *values,
          vector<double,_std::allocator<double>_> *desired)

{
  _Vector_base<double,_std::allocator<double>_> _Stack_78;
  _Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> local_60;
  _Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> local_48;
  _Vector_base<double,_std::allocator<double>_> local_30;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_30,
             (vector<double,_std::allocator<double>_> *)this);
  continuous((cvector *)&local_48,(vector<double,_std::allocator<double>_> *)&local_30);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&_Stack_78,values);
  continuous((cvector *)&local_60,(vector<double,_std::allocator<double>_> *)&_Stack_78);
  learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
  sample(__return_storage_ptr__,(cvector *)&local_48,
         (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_60);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            (&local_60);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_78);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            (&local_48);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_30);
  return __return_storage_ptr__;
}

Assistant:

learning::sample<Desired> continuous(const std::vector<double> &values, const Input &desired) {
            return learning::sample<Desired>(continuous(values), continuous(desired));
        }